

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

void __thiscall apngasm::APNGAsm::processing_start(APNGAsm *this,void *frame_ptr,bool hasInfo)

{
  uchar *puVar1;
  int iVar2;
  png_structp ppVar3;
  png_infop ppVar4;
  __jmp_buf_tag *__env;
  size_type sVar5;
  reference pvVar6;
  uint local_28;
  uint i;
  undefined8 uStack_21;
  uchar header [8];
  bool hasInfo_local;
  void *frame_ptr_local;
  APNGAsm *this_local;
  
  uStack_21 = 0xa1a0a0d474e5089;
  header[0] = hasInfo;
  unique0x10000219 = frame_ptr;
  ppVar3 = (png_structp)png_create_read_struct("1.6.37",0,0);
  this->_png = ppVar3;
  ppVar4 = (png_infop)png_create_info_struct(this->_png);
  this->_info = ppVar4;
  if ((this->_png != (png_structp)0x0) && (this->_info != (png_infop)0x0)) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(this->_png,longjmp,200);
    iVar2 = _setjmp(__env);
    if (iVar2 == 0) {
      png_set_crc_action(this->_png,4);
      png_set_progressive_read_fn(this->_png,stack0xffffffffffffffe8,info_fn,row_fn,0);
      png_process_data(this->_png,this->_info,&stack0xffffffffffffffdf,8);
      png_process_data(this->_png,this->_info,(this->_chunkIHDR).p,(this->_chunkIHDR).size);
      if ((header[0] & 1) != 0) {
        for (local_28 = 0;
            sVar5 = std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::size
                              (&this->_info_chunks), local_28 < sVar5; local_28 = local_28 + 1) {
          ppVar3 = this->_png;
          ppVar4 = this->_info;
          pvVar6 = std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::operator[]
                             (&this->_info_chunks,(ulong)local_28);
          puVar1 = pvVar6->p;
          pvVar6 = std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::operator[]
                             (&this->_info_chunks,(ulong)local_28);
          png_process_data(ppVar3,ppVar4,puVar1,pvVar6->size);
        }
      }
    }
    else {
      png_destroy_read_struct(&this->_png,&this->_info,0);
    }
  }
  return;
}

Assistant:

void APNGAsm::processing_start(void * frame_ptr, bool hasInfo)
  {
    unsigned char header[8] = {137, 80, 78, 71, 13, 10, 26, 10};

    _png = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    _info = png_create_info_struct(_png);
    if (!_png || !_info)
      return;

    if (setjmp(png_jmpbuf(_png)))
    {
      png_destroy_read_struct(&_png, &_info, 0);
      return;
    }

    png_set_crc_action(_png, PNG_CRC_QUIET_USE, PNG_CRC_QUIET_USE);
    png_set_progressive_read_fn(_png, frame_ptr, info_fn, row_fn, NULL);
            
    png_process_data(_png, _info, header, 8);
    png_process_data(_png, _info, _chunkIHDR.p, _chunkIHDR.size);

    if (hasInfo)
      for (unsigned int i=0; i<_info_chunks.size(); ++i)
        png_process_data(_png, _info, _info_chunks[i].p, _info_chunks[i].size);
  }